

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Promise<void> __thiscall capnp::ClientHook::whenResolved(ClientHook *this)

{
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *other;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pPVar1;
  Type *func;
  long *in_RSI;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *promise;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> local_38;
  undefined1 local_28 [8];
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> _promise114;
  ClientHook *this_local;
  
  (**(code **)(*in_RSI + 0x18))();
  other = kj::_::readMaybe<kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>>(&local_38);
  kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::NullableValue
            ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)local_28,
             other);
  kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~Maybe(&local_38);
  pPVar1 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_28);
  if (pPVar1 == (Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    func = (Type *)kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::
                   operator*((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>
                              *)local_28);
    kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>::
    then<capnp::ClientHook::whenResolved()::__0>
              ((Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>> *)this,func);
  }
  kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~NullableValue
            ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)local_28);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> ClientHook::whenResolved() {
  KJ_IF_SOME(promise, whenMoreResolved()) {
    return promise.then([](kj::Own<ClientHook>&& resolution) {
      return resolution->whenResolved();
    });
  } else {
    return kj::READY_NOW;
  }
}